

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O0

void PrintStruct(FLispString *out,ZCC_TreeNode *node)

{
  ZCC_TreeNode *this;
  FName local_24;
  ZCC_TreeNode *local_20;
  ZCC_Struct *snode;
  ZCC_TreeNode *node_local;
  FLispString *out_local;
  
  local_20 = node;
  snode = (ZCC_Struct *)node;
  node_local = (ZCC_TreeNode *)out;
  FLispString::Break(out);
  FLispString::Open((FLispString *)node_local,"struct");
  this = node_local;
  FName::FName(&local_24,*(ENamedName *)&local_20[1].SiblingNext);
  FLispString::AddName((FLispString *)this,&local_24);
  PrintNodes((FLispString *)node_local,local_20[1].SiblingPrev,false,true);
  FLispString::Close((FLispString *)node_local);
  return;
}

Assistant:

static void PrintStruct(FLispString &out, ZCC_TreeNode *node)
{
	ZCC_Struct *snode = (ZCC_Struct *)node;
	out.Break();
	out.Open("struct");
	out.AddName(snode->NodeName);
	PrintNodes(out, snode->Body, false, true);
	out.Close();
}